

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixMapfile(unixFile *pFd,i64 nByte)

{
  uint uVar1;
  void *pvVar2;
  unsigned_short uVar3;
  int iVar4;
  void *pvVar5;
  uint *puVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  stat statbuf;
  undefined1 local_c0 [48];
  ulong local_90;
  
  if (0 < pFd->nFetchOut) {
    return 0;
  }
  if ((nByte < 0) &&
     (iVar4 = (*aSyscall[5].pCurrent)((ulong)(uint)pFd->h,local_c0), nByte = local_90, iVar4 != 0))
  {
    return 0x70a;
  }
  uVar10 = pFd->mmapSizeMax;
  if (nByte < pFd->mmapSizeMax) {
    uVar10 = nByte;
  }
  if (uVar10 != pFd->mmapSize) {
    if ((long)uVar10 < 1) {
      if (pFd->pMapRegion != (void *)0x0) {
        (*aSyscall[0x16].pCurrent)(pFd->pMapRegion,pFd->mmapSizeActual);
        pFd->pMapRegion = (void *)0x0;
        pFd->mmapSize = 0;
        pFd->mmapSizeActual = 0;
      }
    }
    else {
      uVar1 = pFd->h;
      pvVar2 = pFd->pMapRegion;
      uVar3 = pFd->ctrlFlags;
      if (pvVar2 == (void *)0x0) {
        pcVar8 = "mmap";
        pvVar5 = (void *)0x0;
      }
      else {
        uVar7 = pFd->mmapSize & 0xfffffffffffffe00;
        if (pFd->mmapSizeActual != uVar7) {
          (*aSyscall[0x16].pCurrent)((long)pvVar2 + uVar7);
        }
        pvVar5 = (void *)(*aSyscall[0x17].pCurrent)(pvVar2,uVar7,uVar10,1);
        if ((long)pvVar5 + 1U < 2) {
          (*aSyscall[0x16].pCurrent)(pvVar2,uVar7);
        }
        pcVar8 = "mremap";
      }
      if (pvVar5 == (void *)0x0) {
        pvVar5 = (void *)(*aSyscall[0x15].pCurrent)
                                   (0,uVar10,(ulong)((uint)((uVar3 & 2) == 0) * 2 + 1),1,
                                    (ulong)uVar1,0);
      }
      if (pvVar5 == (void *)0xffffffffffffffff) {
        pcVar9 = pFd->zPath;
        puVar6 = (uint *)__errno_location();
        if (pcVar9 == (char *)0x0) {
          pcVar9 = "";
        }
        pvVar5 = (void *)0x0;
        sqlite3_log(0,"os_unix.c:%d: (%d) %s(%s) - %s",0x6c94,(ulong)*puVar6,pcVar8,pcVar9,"");
        pFd->mmapSizeMax = 0;
        uVar10 = 0;
      }
      pFd->pMapRegion = pvVar5;
      pFd->mmapSizeActual = uVar10;
      pFd->mmapSize = uVar10;
    }
  }
  return 0;
}

Assistant:

static int unixMapfile(unixFile *pFd, i64 nByte){
#if SQLITE_MAX_MMAP_SIZE>0
  i64 nMap = nByte;
  int rc;

  assert( nMap>=0 || pFd->nFetchOut==0 );
  if( pFd->nFetchOut>0 ) return SQLITE_OK;

  if( nMap<0 ){
    struct stat statbuf;          /* Low-level file information */
    rc = osFstat(pFd->h, &statbuf);
    if( rc!=SQLITE_OK ){
      return SQLITE_IOERR_FSTAT;
    }
    nMap = statbuf.st_size;
  }
  if( nMap>pFd->mmapSizeMax ){
    nMap = pFd->mmapSizeMax;
  }

  if( nMap!=pFd->mmapSize ){
    if( nMap>0 ){
      unixRemapfile(pFd, nMap);
    }else{
      unixUnmapfile(pFd);
    }
  }
#endif

  return SQLITE_OK;
}